

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessNetworkDiagJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  size_type *psVar1;
  bool *pbVar2;
  ErrorCode EVar3;
  pointer pbVar4;
  element_type *peVar5;
  CommissionerAppPtr *pCVar6;
  int iVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  string *psVar10;
  char *pcVar11;
  int *piVar12;
  _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
  *p_Var13;
  long *plVar14;
  undefined8 *puVar15;
  _Rb_tree_node_base *p_Var16;
  long *plVar17;
  undefined8 uVar18;
  _Alloc_hider _Var19;
  char *pcVar20;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar21;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  DiagAnsDataMap diagAnsDataMaps;
  string dstAddr;
  NetDiagData diagData;
  string local_3c8;
  byte local_3a5;
  undefined4 local_3a4;
  undefined1 local_3a0 [8];
  _Alloc_hider local_398;
  char local_390 [8];
  char local_388 [16];
  _Alloc_hider local_378;
  size_type local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  string *local_358;
  string *local_350;
  string local_348;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_328;
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  long lStack_2d0;
  CommissionerAppPtr *local_2c8;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  undefined1 *local_240;
  undefined8 local_238;
  undefined1 local_230 [16];
  Expression *local_220;
  undefined4 local_218;
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  undefined4 local_1f0;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  undefined4 local_1c8 [2];
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  undefined4 local_1a0 [2];
  long local_198;
  long local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined4 local_178 [2];
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  undefined4 local_150 [2];
  undefined1 *local_148;
  long local_140;
  undefined1 local_138 [16];
  undefined2 local_128;
  undefined1 local_126;
  void *local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  void *pvStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined2 local_f0;
  undefined1 local_e8;
  void *local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  void *pvStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined8 uStack_8c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  void *pvStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  local_50;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  local_358 = (string *)&(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  local_350 = (string *)&__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_240 = local_230;
  local_238 = 0;
  local_230[0] = 0;
  local_128 = 0;
  local_126 = 0;
  local_e8 = 0;
  local_120 = (void *)0x0;
  uStack_118 = 0;
  local_110 = 0;
  pvStack_108 = (void *)0x0;
  local_100 = 0;
  uStack_f8 = 0;
  local_f0 = 0;
  local_e0 = (void *)0x0;
  uStack_d8 = 0;
  local_d0 = 0;
  pvStack_c8 = (void *)0x0;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  local_a0 = 0;
  uStack_98 = 0;
  uStack_94 = 0;
  uStack_90 = 0;
  uStack_8c = 0;
  local_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvStack_68 = (void *)0x0;
  local_60 = 0;
  uStack_58 = 0;
  local_50.
  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.
  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_38 = 0;
  pbVar4 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4;
  if (uVar8 < 0x41) {
    local_328.types_[0] = cstring_type;
    local_328.types_[1] = cstring_type;
    local_328.context_.super_basic_format_parse_context<char>.format_str_.data_ = "{} \n {}";
    local_328.context_.super_basic_format_parse_context<char>.format_str_.size_ = 7;
    local_328.context_.super_basic_format_parse_context<char>._16_8_ =
         (_Rb_tree_node_base *)0x200000000;
    local_328.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<char[18],fmt::v10::detail::compile_parse_context<char>>;
    local_328.parse_funcs_[1] =
         ::fmt::v10::detail::
         parse_format_specs<char[62],fmt::v10::detail::compile_parse_context<char>>;
    pcVar20 = "{} \n {}";
    local_328.context_.types_ = local_328.types_;
    do {
      pcVar11 = pcVar20 + 1;
      if (*pcVar20 == '}') {
        if ((pcVar11 == "") || (*pcVar11 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar11 = pcVar20 + 2;
      }
      else if (*pcVar20 == '{') {
        pcVar11 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char[18],char[62]>&>
                            (pcVar20,"",&local_328);
      }
      pcVar20 = pcVar11;
    } while (pcVar11 != "");
    local_328.types_ = (type  [2])0x26a6c1;
    local_328.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x26a6d3;
    fmt.size_ = 0xcc;
    fmt.data_ = (char *)0x7;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_328;
    ::fmt::v10::vformat_abi_cxx11_(&local_3c8,(v10 *)"{} \n {}",fmt,args);
    local_1f0 = 2;
    local_1e8 = local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,local_3c8._M_dataplus._M_p,
               &((ModeData *)local_3c8._M_string_length)->mIsRxOnWhenIdleMode +
               (long)local_3c8._M_dataplus._M_p);
    local_3a0._0_4_ = local_1f0;
    local_398._M_p = local_388;
    std::__cxx11::string::_M_construct<char*>((string *)&local_398,local_1e8,local_1e8 + local_1e0);
    local_370 = 0;
    local_368._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
    local_378._M_p = (pointer)&local_368;
    std::__cxx11::string::operator=(local_358,(string *)&local_398);
    std::__cxx11::string::operator=(local_350,(string *)&local_378);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_p != &local_368) {
      operator_delete(local_378._M_p);
    }
    if (local_398._M_p != local_388) {
      operator_delete(local_398._M_p);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
    paVar9 = &local_3c8.field_2;
LAB_001d0ead:
    _Var19._M_p = (pointer)(&paVar9->_M_allocated_capacity)[-2];
  }
  else {
    if ((uVar8 == 0x60) || (pbVar4[3]._M_string_length == 0)) {
      local_238 = 0;
      local_230[0] = 0;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_240);
    }
    pbVar4 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    paVar9 = &local_3c8.field_2;
    local_3c8._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"query","");
    utils::ToLower((string *)local_3a0,pbVar4 + 1);
    psVar10 = utils::ToLower((string *)&local_328,&local_3c8);
    if (local_398._M_p ==
        local_328.context_.super_basic_format_parse_context<char>.format_str_.data_) {
      if (local_398._M_p == (char *)0x0) {
        local_3a4 = (undefined4)CONCAT71((int7)((ulong)psVar10 >> 8),1);
      }
      else {
        iVar7 = bcmp((void *)local_3a0,(void *)local_328.types_,(size_t)local_398._M_p);
        local_3a4 = CONCAT31((int3)((uint)iVar7 >> 8),iVar7 == 0);
      }
    }
    else {
      local_3a4 = 0;
    }
    if (local_328.types_ != (type  [2])((long)&local_328 + 0x10U)) {
      operator_delete((void *)local_328.types_);
    }
    if (local_3a0 != (undefined1  [8])local_390) {
      operator_delete((void *)local_3a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != paVar9) {
      operator_delete(local_3c8._M_dataplus._M_p);
    }
    if ((char)local_3a4 != '\0') {
LAB_001d1052:
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_3c8._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"extaddr","");
      utils::ToLower((string *)local_3a0,pbVar4 + 2);
      utils::ToLower((string *)&local_328,&local_3c8);
      bVar21 = true;
      if (local_398._M_p ==
          local_328.context_.super_basic_format_parse_context<char>.format_str_.data_) {
        if (local_398._M_p == (char *)0x0) {
          bVar21 = false;
        }
        else {
          iVar7 = bcmp((void *)local_3a0,(void *)local_328.types_,(size_t)local_398._M_p);
          bVar21 = iVar7 != 0;
        }
      }
      if (local_328.types_ != (type  [2])((long)&local_328 + 0x10U)) {
        operator_delete((void *)local_328.types_);
      }
      if (local_3a0 != (undefined1  [8])local_390) {
        operator_delete((void *)local_3a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != paVar9) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      local_3a5 = (byte)local_3a4 ^ 1;
      if (!bVar21 && local_3a5 == 0) {
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        local_220 = aExpr;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x35])
                  (local_150,peVar5,&local_240,1);
        local_3a0._0_4_ = local_150[0];
        local_398._M_p = local_388;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,local_148,local_148 + local_140);
        local_370 = 0;
        local_368._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
        local_378._M_p = (pointer)&local_368;
        std::__cxx11::string::operator=(local_358,(string *)&local_398);
        std::__cxx11::string::operator=(local_350,(string *)&local_378);
        EVar3 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_p != &local_368) {
          operator_delete(local_378._M_p);
        }
        if (local_398._M_p != local_388) {
          operator_delete(local_398._M_p);
        }
        if (local_148 != local_138) {
          operator_delete(local_148);
        }
        if (EVar3 != kNone) goto LAB_001d202e;
        local_3a0 = (undefined1  [8])0x1;
        local_398._M_p = (char *)0x0;
        do {
          iVar7 = nanosleep((timespec *)local_3a0,(timespec *)local_3a0);
          if (iVar7 != -1) break;
          piVar12 = __errno_location();
        } while (*piVar12 == 4);
        uStack_38 = 1;
        local_2c8 = aCommissioner;
        p_Var13 = &CommissionerApp::GetNetDiagTlvs
                             ((aCommissioner->
                              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->_M_t;
        std::
        _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
        ::_Rb_tree((_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                    *)&local_328,p_Var13);
        aExpr = local_220;
        if (local_328.context_.super_basic_format_parse_context<char>._16_8_ != (long)&local_328 + 8
           ) {
          p_Var16 = (_Rb_tree_node_base *)
                    local_328.context_.super_basic_format_parse_context<char>._16_8_;
          do {
            Address::ToString_abi_cxx11_(&local_2c0,(Address *)(p_Var16 + 1));
            plVar14 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_2c0,0,(char *)0x0,0x26a719);
            plVar17 = plVar14 + 2;
            if ((long *)*plVar14 == plVar17) {
              local_2d8 = *plVar17;
              lStack_2d0 = plVar14[3];
              local_2e8 = &local_2d8;
            }
            else {
              local_2d8 = *plVar17;
              local_2e8 = (long *)*plVar14;
            }
            local_2e0 = plVar14[1];
            *plVar14 = (long)plVar17;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            plVar14 = (long *)std::__cxx11::string::append((char *)&local_2e8);
            local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
            plVar17 = plVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar17) {
              local_3c8.field_2._M_allocated_capacity = *plVar17;
              local_3c8.field_2._8_8_ = plVar14[3];
            }
            else {
              local_3c8.field_2._M_allocated_capacity = *plVar17;
              local_3c8._M_dataplus._M_p = (pointer)*plVar14;
            }
            local_3c8._M_string_length = plVar14[1];
            *plVar14 = (long)plVar17;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            NetDiagDataToJson_abi_cxx11_
                      (&local_348,(commissioner *)&p_Var16[1]._M_right,
                       (NetDiagData *)local_3c8._M_string_length);
            uVar18 = (undefined1 *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
              uVar18 = local_3c8.field_2._M_allocated_capacity;
            }
            pbVar2 = &((ModeData *)local_3c8._M_string_length)->mIsRxOnWhenIdleMode +
                     local_348._M_string_length;
            if ((ulong)uVar18 < pbVar2) {
              uVar18 = (undefined1 *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                uVar18 = local_348.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar18 < pbVar2) goto LAB_001d1556;
              puVar15 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_348,0,(char *)0x0,(ulong)local_3c8._M_dataplus._M_p
                                  );
            }
            else {
LAB_001d1556:
              puVar15 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_3c8,(ulong)local_348._M_dataplus._M_p);
            }
            psVar1 = puVar15 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_260.field_2._M_allocated_capacity = *psVar1;
              local_260.field_2._8_8_ = puVar15[3];
              local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            }
            else {
              local_260.field_2._M_allocated_capacity = *psVar1;
              local_260._M_dataplus._M_p = (pointer)*puVar15;
            }
            local_260._M_string_length = puVar15[1];
            *puVar15 = psVar1;
            puVar15[1] = 0;
            *(undefined1 *)psVar1 = 0;
            Value::Value((Value *)local_3a0,&local_260);
            (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
            std::__cxx11::string::operator=(local_358,(string *)&local_398);
            std::__cxx11::string::operator=(local_350,(string *)&local_378);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_p != &local_368) {
              operator_delete(local_378._M_p);
            }
            if (local_398._M_p != local_388) {
              operator_delete(local_398._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
              operator_delete(local_3c8._M_dataplus._M_p);
            }
            if (local_2e8 != &local_2d8) {
              operator_delete(local_2e8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
              operator_delete(local_2c0._M_dataplus._M_p);
            }
            p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
          } while (p_Var16 != (_Rb_tree_node_base *)((long)&local_328 + 8));
        }
        std::
        _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
        ::~_Rb_tree((_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                     *)&local_328);
        aCommissioner = local_2c8;
      }
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"rloc16","");
      utils::ToLower((string *)local_3a0,pbVar4 + 2);
      utils::ToLower((string *)&local_328,&local_3c8);
      bVar21 = true;
      if (local_398._M_p ==
          local_328.context_.super_basic_format_parse_context<char>.format_str_.data_) {
        if (local_398._M_p == (char *)0x0) {
          bVar21 = false;
        }
        else {
          iVar7 = bcmp((void *)local_3a0,(void *)local_328.types_,(size_t)local_398._M_p);
          bVar21 = iVar7 != 0;
        }
      }
      if (local_328.types_ != (type  [2])((long)&local_328 + 0x10U)) {
        operator_delete((void *)local_328.types_);
      }
      if (local_3a0 != (undefined1  [8])local_390) {
        operator_delete((void *)local_3a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if (!bVar21 && local_3a5 == 0) {
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x35])
                  (local_178,peVar5,&local_240,2);
        local_3a0._0_4_ = local_178[0];
        local_398._M_p = local_388;
        local_2c8 = aCommissioner;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,local_170,local_170 + local_168);
        local_370 = 0;
        local_368._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
        local_378._M_p = (pointer)&local_368;
        std::__cxx11::string::operator=(local_358,(string *)&local_398);
        std::__cxx11::string::operator=(local_350,(string *)&local_378);
        EVar3 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_p != &local_368) {
          operator_delete(local_378._M_p);
        }
        if (local_398._M_p != local_388) {
          operator_delete(local_398._M_p);
        }
        pCVar6 = local_2c8;
        if (local_170 != local_160) {
          operator_delete(local_170);
        }
        if (EVar3 != kNone) goto LAB_001d202e;
        local_3a0 = (undefined1  [8])0x1;
        local_398._M_p = (char *)0x0;
        do {
          iVar7 = nanosleep((timespec *)local_3a0,(timespec *)local_3a0);
          if (iVar7 != -1) break;
          piVar12 = __errno_location();
        } while (*piVar12 == 4);
        uStack_38 = 2;
        p_Var13 = &CommissionerApp::GetNetDiagTlvs
                             ((pCVar6->
                              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->_M_t;
        std::
        _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
        ::_Rb_tree((_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                    *)&local_328,p_Var13);
        if (local_328.context_.super_basic_format_parse_context<char>._16_8_ != (long)&local_328 + 8
           ) {
          p_Var16 = (_Rb_tree_node_base *)
                    local_328.context_.super_basic_format_parse_context<char>._16_8_;
          do {
            Address::ToString_abi_cxx11_(&local_2c0,(Address *)(p_Var16 + 1));
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,0x26a719);
            plVar14 = puVar15 + 2;
            if ((long *)*puVar15 == plVar14) {
              local_2d8 = *plVar14;
              lStack_2d0 = puVar15[3];
              local_2e8 = &local_2d8;
            }
            else {
              local_2d8 = *plVar14;
              local_2e8 = (long *)*puVar15;
            }
            local_2e0 = puVar15[1];
            *puVar15 = plVar14;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
            local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
            plVar14 = puVar15 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar14) {
              local_3c8.field_2._M_allocated_capacity = *plVar14;
              local_3c8.field_2._8_8_ = puVar15[3];
            }
            else {
              local_3c8.field_2._M_allocated_capacity = *plVar14;
              local_3c8._M_dataplus._M_p = (pointer)*puVar15;
            }
            local_3c8._M_string_length = puVar15[1];
            *puVar15 = plVar14;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            NetDiagDataToJson_abi_cxx11_
                      (&local_348,(commissioner *)&p_Var16[1]._M_right,
                       (NetDiagData *)local_3c8._M_string_length);
            uVar18 = (undefined1 *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
              uVar18 = local_3c8.field_2._M_allocated_capacity;
            }
            pbVar2 = &((ModeData *)local_3c8._M_string_length)->mIsRxOnWhenIdleMode +
                     local_348._M_string_length;
            if ((ulong)uVar18 < pbVar2) {
              uVar18 = (undefined1 *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                uVar18 = local_348.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar18 < pbVar2) goto LAB_001d1a15;
              puVar15 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_348,0,(char *)0x0,(ulong)local_3c8._M_dataplus._M_p
                                  );
            }
            else {
LAB_001d1a15:
              puVar15 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_3c8,(ulong)local_348._M_dataplus._M_p);
            }
            psVar1 = puVar15 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_280.field_2._M_allocated_capacity = *psVar1;
              local_280.field_2._8_8_ = puVar15[3];
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
            }
            else {
              local_280.field_2._M_allocated_capacity = *psVar1;
              local_280._M_dataplus._M_p = (pointer)*puVar15;
            }
            local_280._M_string_length = puVar15[1];
            *puVar15 = psVar1;
            puVar15[1] = 0;
            *(undefined1 *)psVar1 = 0;
            Value::Value((Value *)local_3a0,&local_280);
            (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
            std::__cxx11::string::operator=(local_358,(string *)&local_398);
            std::__cxx11::string::operator=(local_350,(string *)&local_378);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_p != &local_368) {
              operator_delete(local_378._M_p);
            }
            if (local_398._M_p != local_388) {
              operator_delete(local_398._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
              operator_delete(local_3c8._M_dataplus._M_p);
            }
            if (local_2e8 != &local_2d8) {
              operator_delete(local_2e8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
              operator_delete(local_2c0._M_dataplus._M_p);
            }
            p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
          } while (p_Var16 != (_Rb_tree_node_base *)((long)&local_328 + 8));
        }
        std::
        _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
        ::~_Rb_tree((_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                     *)&local_328);
        aCommissioner = local_2c8;
      }
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"maccounters","");
      utils::ToLower((string *)local_3a0,pbVar4 + 2);
      utils::ToLower((string *)&local_328,&local_3c8);
      if (local_398._M_p ==
          local_328.context_.super_basic_format_parse_context<char>.format_str_.data_) {
        if (local_398._M_p == (char *)0x0) {
          bVar21 = true;
        }
        else {
          iVar7 = bcmp((void *)local_3a0,(void *)local_328.types_,(size_t)local_398._M_p);
          bVar21 = iVar7 == 0;
        }
      }
      else {
        bVar21 = false;
      }
      if (local_328.types_ != (type  [2])((long)&local_328 + 0x10U)) {
        operator_delete((void *)local_328.types_);
      }
      if (local_3a0 != (undefined1  [8])local_390) {
        operator_delete((void *)local_3a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if (!bVar21) goto LAB_001d202e;
      if ((char)local_3a4 != '\0') {
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x35])
                  (local_1c8,peVar5,&local_240,0x100);
        local_3a0._0_4_ = local_1c8[0];
        local_398._M_p = local_388;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,local_1c0,local_1c0 + local_1b8);
        local_370 = 0;
        local_368._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
        local_378._M_p = (pointer)&local_368;
        std::__cxx11::string::operator=(local_358,(string *)&local_398);
        std::__cxx11::string::operator=(local_350,(string *)&local_378);
        EVar3 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_p != &local_368) {
          operator_delete(local_378._M_p);
        }
        if (local_398._M_p != local_388) {
          operator_delete(local_398._M_p);
        }
        if (local_1c0 != local_1b0) {
          operator_delete(local_1c0);
        }
        if (EVar3 == kNone) {
          local_3a0 = (undefined1  [8])0x1;
          local_398._M_p = (char *)0x0;
          do {
            iVar7 = nanosleep((timespec *)local_3a0,(timespec *)local_3a0);
            if (iVar7 != -1) break;
            piVar12 = __errno_location();
          } while (*piVar12 == 4);
          uStack_38 = 0x100;
          p_Var13 = &CommissionerApp::GetNetDiagTlvs
                               ((aCommissioner->
                                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->_M_t;
          std::
          _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
          ::_Rb_tree((_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                      *)&local_328,p_Var13);
          if (local_328.context_.super_basic_format_parse_context<char>._16_8_ !=
              (long)&local_328 + 8) {
            p_Var16 = (_Rb_tree_node_base *)
                      local_328.context_.super_basic_format_parse_context<char>._16_8_;
            do {
              Address::ToString_abi_cxx11_(&local_2c0,(Address *)(p_Var16 + 1));
              puVar15 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,0x26a719);
              plVar14 = puVar15 + 2;
              if ((long *)*puVar15 == plVar14) {
                local_2d8 = *plVar14;
                lStack_2d0 = puVar15[3];
                local_2e8 = &local_2d8;
              }
              else {
                local_2d8 = *plVar14;
                local_2e8 = (long *)*puVar15;
              }
              local_2e0 = puVar15[1];
              *puVar15 = plVar14;
              puVar15[1] = 0;
              *(undefined1 *)(puVar15 + 2) = 0;
              puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
              local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
              plVar14 = puVar15 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar14) {
                local_3c8.field_2._M_allocated_capacity = *plVar14;
                local_3c8.field_2._8_8_ = puVar15[3];
              }
              else {
                local_3c8.field_2._M_allocated_capacity = *plVar14;
                local_3c8._M_dataplus._M_p = (pointer)*puVar15;
              }
              local_3c8._M_string_length = puVar15[1];
              *puVar15 = plVar14;
              puVar15[1] = 0;
              *(undefined1 *)(puVar15 + 2) = 0;
              NetDiagDataToJson_abi_cxx11_
                        (&local_348,(commissioner *)&p_Var16[1]._M_right,
                         (NetDiagData *)local_3c8._M_string_length);
              uVar18 = (undefined1 *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                uVar18 = local_3c8.field_2._M_allocated_capacity;
              }
              pbVar2 = &((ModeData *)local_3c8._M_string_length)->mIsRxOnWhenIdleMode +
                       local_348._M_string_length;
              if ((ulong)uVar18 < pbVar2) {
                uVar18 = (undefined1 *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p != &local_348.field_2) {
                  uVar18 = local_348.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar18 < pbVar2) goto LAB_001d1ece;
                puVar15 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_348,0,(char *)0x0,
                                     (ulong)local_3c8._M_dataplus._M_p);
              }
              else {
LAB_001d1ece:
                puVar15 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_3c8,(ulong)local_348._M_dataplus._M_p);
              }
              psVar1 = puVar15 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_2a0.field_2._M_allocated_capacity = *psVar1;
                local_2a0.field_2._8_8_ = puVar15[3];
                local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
              }
              else {
                local_2a0.field_2._M_allocated_capacity = *psVar1;
                local_2a0._M_dataplus._M_p = (pointer)*puVar15;
              }
              local_2a0._M_string_length = puVar15[1];
              *puVar15 = psVar1;
              puVar15[1] = 0;
              *(undefined1 *)psVar1 = 0;
              Value::Value((Value *)local_3a0,&local_2a0);
              (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
              std::__cxx11::string::operator=(local_358,(string *)&local_398);
              std::__cxx11::string::operator=(local_350,(string *)&local_378);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._M_p != &local_368) {
                operator_delete(local_378._M_p);
              }
              if (local_398._M_p != local_388) {
                operator_delete(local_398._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                operator_delete(local_3c8._M_dataplus._M_p);
              }
              if (local_2e8 != &local_2d8) {
                operator_delete(local_2e8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                operator_delete(local_2c0._M_dataplus._M_p);
              }
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
            } while (p_Var16 != (_Rb_tree_node_base *)((long)&local_328 + 8));
          }
          std::
          _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
          ::~_Rb_tree((_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
                       *)&local_328);
        }
        goto LAB_001d202e;
      }
      peVar5 = (aCommissioner->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x36])
                (local_1a0,peVar5,&local_240,0x100);
      local_3a0._0_4_ = local_1a0[0];
      local_398._M_p = local_388;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_398,local_198,local_190 + local_198);
      local_370 = 0;
      local_368._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
      local_378._M_p = (pointer)&local_368;
      std::__cxx11::string::operator=(local_358,(string *)&local_398);
      std::__cxx11::string::operator=(local_350,(string *)&local_378);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_p != &local_368) {
        operator_delete(local_378._M_p);
      }
      if (local_398._M_p != local_388) {
        operator_delete(local_398._M_p);
      }
      paVar9 = &local_188;
      goto LAB_001d0ead;
    }
    pbVar4 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_3c8._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"reset","");
    utils::ToLower((string *)local_3a0,pbVar4 + 1);
    utils::ToLower((string *)&local_328,&local_3c8);
    if (local_398._M_p ==
        local_328.context_.super_basic_format_parse_context<char>.format_str_.data_) {
      if (local_398._M_p == (char *)0x0) {
        bVar21 = true;
      }
      else {
        iVar7 = bcmp((void *)local_3a0,(void *)local_328.types_,(size_t)local_398._M_p);
        bVar21 = iVar7 == 0;
      }
    }
    else {
      bVar21 = false;
    }
    if (local_328.types_ != (type  [2])((long)&local_328 + 0x10U)) {
      operator_delete((void *)local_328.types_);
    }
    if (local_3a0 != (undefined1  [8])local_390) {
      operator_delete((void *)local_3a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != paVar9) {
      operator_delete(local_3c8._M_dataplus._M_p);
    }
    if (bVar21) goto LAB_001d1052;
    local_328.types_[0] = string_type;
    local_328.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "\'{}\' is not a valid sub-command";
    local_328.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1f;
    local_328.context_.super_basic_format_parse_context<char>._16_8_ =
         (_Rb_tree_node_base *)0x100000000;
    local_328.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    pcVar20 = "\'{}\' is not a valid sub-command";
    local_328.context_.types_ = local_328.types_;
    do {
      pcVar11 = pcVar20 + 1;
      if (*pcVar20 == '}') {
        if ((pcVar11 == "") || (*pcVar11 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar11 = pcVar20 + 2;
      }
      else if (*pcVar20 == '{') {
        pcVar11 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                            (pcVar20,"",(format_string_checker<char> *)&local_328);
      }
      pcVar20 = pcVar11;
    } while (pcVar11 != "");
    pbVar4 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_328.types_ = (type  [2])pbVar4[1]._M_dataplus._M_p;
    local_328.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)pbVar4[1]._M_string_length;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x1f;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_328;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_3c8,(v10 *)"\'{}\' is not a valid sub-command",fmt_00,args_00);
    local_218 = 3;
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,local_3c8._M_dataplus._M_p,
               &((ModeData *)local_3c8._M_string_length)->mIsRxOnWhenIdleMode +
               (long)local_3c8._M_dataplus._M_p);
    local_3a0._0_4_ = local_218;
    local_398._M_p = local_388;
    std::__cxx11::string::_M_construct<char*>((string *)&local_398,local_210,local_210 + local_208);
    local_370 = 0;
    local_368._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_3a0._0_4_;
    local_378._M_p = (pointer)&local_368;
    std::__cxx11::string::operator=(local_358,(string *)&local_398);
    std::__cxx11::string::operator=(local_350,(string *)&local_378);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_p != &local_368) {
      operator_delete(local_378._M_p);
    }
    if (local_398._M_p != local_388) {
      operator_delete(local_398._M_p);
    }
    if (local_210 != local_200) {
      operator_delete(local_210);
    }
    paVar9 = &local_3c8.field_2;
    _Var19._M_p = local_3c8._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var19._M_p != paVar9) {
    operator_delete(_Var19._M_p);
  }
LAB_001d202e:
  std::
  vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ::~vector(&local_50);
  if (pvStack_68 != (void *)0x0) {
    operator_delete(pvStack_68);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  if (pvStack_c8 != (void *)0x0) {
    operator_delete(pvStack_c8);
  }
  if (local_e0 != (void *)0x0) {
    operator_delete(local_e0);
  }
  if (pvStack_108 != (void *)0x0) {
    operator_delete(pvStack_108);
  }
  if (local_120 != (void *)0x0) {
    operator_delete(local_120);
  }
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessNetworkDiagJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value       value;
    uint64_t    flags         = 0;
    uint8_t     operationType = 0;
    std::string dstAddr;
    NetDiagData diagData;

    VerifyOrExit(aExpr.size() >= 3,
                 value = ERROR_INVALID_ARGS("{} \n {}", SYNTAX_FEW_ARGS,
                                            "netdiag [query] [extaddr | rloc16 ] <dest mesh local address>"));
    if (aExpr.size() > 3 && !aExpr[3].empty())
    {
        dstAddr = aExpr[3];
    }
    else
    {
        dstAddr.clear();
    }

    if (CaseInsensitiveEqual(aExpr[1], "query"))
    {
        operationType = DIAG_GET_QRY_TYPE;
    }
    else if (CaseInsensitiveEqual(aExpr[1], "reset"))
    {
        operationType = DIAG_RST_NTF_TYPE;
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

    if (CaseInsensitiveEqual(aExpr[2], "extaddr"))
    {
        flags = NetDiagData::kExtMacAddrBit;
        if (operationType == DIAG_GET_QRY_TYPE)
        {
            SuccessOrExit(value = aCommissioner->CommandDiagGetQuery(dstAddr, flags));
            std::this_thread::sleep_for(std::chrono::milliseconds(1000));
            diagData.mPresentFlags         = flags;
            DiagAnsDataMap diagAnsDataMaps = aCommissioner->GetNetDiagTlvs();
            for (auto &diagAnsDataMap : diagAnsDataMaps)
            {
                value = "Peer Address: " + (diagAnsDataMap.first).ToString() +
                        "\nContent: " + NetDiagDataToJson(diagAnsDataMap.second);
            }
        }
    }
    if (CaseInsensitiveEqual(aExpr[2], "rloc16"))
    {
        flags = NetDiagData::kMacAddrBit;
        if (operationType == DIAG_GET_QRY_TYPE)
        {
            SuccessOrExit(value = aCommissioner->CommandDiagGetQuery(dstAddr, flags));
            std::this_thread::sleep_for(std::chrono::milliseconds(1000));
            diagData.mPresentFlags         = flags;
            DiagAnsDataMap diagAnsDataMaps = aCommissioner->GetNetDiagTlvs();
            for (auto &diagAnsDataMap : diagAnsDataMaps)
            {
                value = "Peer Address: " + (diagAnsDataMap.first).ToString() +
                        "\nContent: " + NetDiagDataToJson(diagAnsDataMap.second);
            }
        }
    }
    if (CaseInsensitiveEqual(aExpr[2], "maccounters"))
    {
        flags = NetDiagData::kMacCountersBit;
        if (operationType == DIAG_RST_NTF_TYPE)
        {
            SuccessOrExit(value = aCommissioner->CommandDiagReset(dstAddr, flags));
        }
        else if (operationType == DIAG_GET_QRY_TYPE)
        {
            SuccessOrExit(value = aCommissioner->CommandDiagGetQuery(dstAddr, flags));
            std::this_thread::sleep_for(std::chrono::milliseconds(1000));
            diagData.mPresentFlags         = flags;
            DiagAnsDataMap diagAnsDataMaps = aCommissioner->GetNetDiagTlvs();
            for (auto &diagAnsDataMap : diagAnsDataMaps)
            {
                value = "Peer Address: " + (diagAnsDataMap.first).ToString() +
                        "\nContent: " + NetDiagDataToJson(diagAnsDataMap.second);
            }
        }
    }

exit:
    return value;
}